

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::Section::~Section(Section *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__Section_001316f8;
  List::~List(&this->items);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

~Section		(void) {}